

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_gzip.c
# Opt level: O0

void test_write_filter_gzip(void)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  void *__ptr;
  void *__s;
  archive_entry *paVar4;
  archive *paVar5;
  archive_entry *paVar6;
  long lVar7;
  char *file;
  int use_prog;
  int r;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff08;
  archive *paVar8;
  void *pvVar9;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar10;
  uint in_stack_ffffffffffffff14;
  wchar_t in_stack_ffffffffffffff18;
  wchar_t in_stack_ffffffffffffff1c;
  archive *in_stack_ffffffffffffff20;
  archive *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  char local_48 [24];
  void *pvVar11;
  archive_entry *local_8;
  
  bVar1 = false;
  __ptr = malloc(2000000);
  assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                   in_stack_ffffffffffffff18,
                   (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
  if (__ptr != (void *)0x0) {
    pvVar11 = (void *)0x2710;
    __s = malloc(10000);
    assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                     in_stack_ffffffffffffff18,
                     (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
    if (__s == (void *)0x0) {
      free(__ptr);
    }
    else {
      memset(__s,0,(size_t)pvVar11);
      paVar4 = (archive_entry *)archive_write_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08);
      archive_write_set_format_ustar
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (longlong)paVar4,(char *)0x1d7fd7,in_stack_ffffffffffffff40);
      iVar2 = archive_write_add_filter_gzip(in_stack_ffffffffffffff28);
      if (iVar2 != 0) {
        wVar3 = canGzip();
        if ((wVar3 == L'\0') || (iVar2 != -0x14)) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'E');
          wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20);
          test_skipping("gzip writing not supported on this platform");
          archive_write_free((archive *)0x1d8046);
          assertion_equal_int((char *)in_stack_ffffffffffffff28,wVar3,
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              0,(char *)0x1d8074,in_stack_ffffffffffffff40);
          free(__ptr);
          free(__s);
          return;
        }
        bVar1 = true;
      }
      archive_write_set_bytes_per_block
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14);
      paVar6 = paVar4;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (longlong)paVar4,(char *)0x1d80d9,in_stack_ffffffffffffff40);
      archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (int)((ulong)paVar6 >> 0x20));
      iVar2 = 0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),0,
                          (char *)0x1d8119,in_stack_ffffffffffffff40);
      archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          iVar2);
      uVar10 = 0;
      assertion_equal_string
                (in_stack_ffffffffffffff38,(wchar_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char *)((ulong)in_stack_ffffffffffffff14 << 0x20),in_stack_ffffffffffffff50,
                 (wchar_t)in_stack_ffffffffffffff58);
      archive_write_open_memory
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (size_t *)CONCAT44(in_stack_ffffffffffffff14,uVar10));
      paVar6 = paVar4;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d81bc,in_stack_ffffffffffffff40);
      local_8 = archive_entry_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       paVar6);
      archive_entry_set_filetype(local_8,0x8000);
      archive_entry_set_size(local_8,(int64_t)pvVar11);
      for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
        sprintf(local_48,"file%03d",(ulong)local_5c);
        archive_entry_copy_pathname
                  ((archive_entry *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar6);
        archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar6);
        paVar6 = paVar4;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                            (char *)0x1d82ab,in_stack_ffffffffffffff40);
        archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar6,0x1d82d8);
        assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18,
                         (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar6);
      }
      archive_entry_free((archive_entry *)0x1d8331);
      archive_write_close((archive *)0x1d833e);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d8370,in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d837d);
      paVar8 = (archive *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d83ab,
                          in_stack_ffffffffffffff40);
      paVar5 = archive_read_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       paVar8);
      archive_read_support_format_all(paVar8);
      paVar8 = paVar5;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                          (char *)0x1d8420,in_stack_ffffffffffffff40);
      iVar2 = archive_read_support_filter_gzip
                        ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (iVar2 == -0x14) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'd');
        test_skipping(
                     "Can\'t verify gzip writing by reading back; gzip reading not fully supported on this platform"
                     );
      }
      else {
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar8,0x1d847f);
        paVar8 = paVar5;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d84b1,in_stack_ffffffffffffff40);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_read_next_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(archive_entry **)paVar8)
          ;
          paVar4 = (archive_entry *)0x0;
          wVar3 = assertion_equal_int((char *)in_stack_ffffffffffffff28,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                      (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,
                                      (char *)0x1d852a,in_stack_ffffffffffffff40);
          if (wVar3 == L'\0') break;
          archive_entry_pathname(paVar4);
          uVar10 = 0;
          assertion_equal_string
                    (in_stack_ffffffffffffff38,(wchar_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (char *)((ulong)in_stack_ffffffffffffff14 << 0x20),in_stack_ffffffffffffff50,
                     (wchar_t)in_stack_ffffffffffffff58);
          archive_entry_size(local_8);
          paVar8 = (archive *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff28,
                              (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d85dc,
                              in_stack_ffffffffffffff40);
        }
        archive_read_close((archive *)0x1d85ff);
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d8631,in_stack_ffffffffffffff40);
      }
      archive_read_free((archive *)0x1d863e);
      pvVar9 = (void *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d866c,
                          in_stack_ffffffffffffff40);
      paVar6 = (archive_entry *)archive_write_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       pvVar9);
      archive_write_set_format_ustar
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d86e1,in_stack_ffffffffffffff40);
      archive_write_set_bytes_per_block
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d8725,in_stack_ffffffffffffff40);
      archive_write_add_filter_gzip(in_stack_ffffffffffffff28);
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d8780,in_stack_ffffffffffffff40);
      archive_write_set_options
                ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d87c9,in_stack_ffffffffffffff40);
      archive_write_set_options
                ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d880f,in_stack_ffffffffffffff40);
      archive_write_set_filter_option
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d8860,in_stack_ffffffffffffff40);
      archive_write_set_filter_option
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d88b4,in_stack_ffffffffffffff40);
      archive_write_set_filter_option
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d8908,in_stack_ffffffffffffff40);
      archive_write_set_options
                ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d894e,in_stack_ffffffffffffff40);
      archive_write_open_memory
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (size_t *)CONCAT44(in_stack_ffffffffffffff14,uVar10));
      paVar4 = paVar6;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d89a5,in_stack_ffffffffffffff40);
      for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
        sprintf(local_48,"file%03d",(ulong)local_5c);
        local_8 = archive_entry_new();
        assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18,
                         (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar4);
        archive_entry_copy_pathname
                  ((archive_entry *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar4);
        archive_entry_set_size(local_8,(int64_t)pvVar11);
        archive_entry_set_filetype(local_8,0x8000);
        archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar4);
        paVar4 = paVar6;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                            (char *)0x1d8a94,in_stack_ffffffffffffff40);
        archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar4,0x1d8abe);
        assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18,
                         (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar4);
        archive_entry_free((archive_entry *)0x1d8afe);
      }
      archive_write_close((archive *)0x1d8b21);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar6,
                          (char *)0x1d8b53,in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d8b60);
      paVar8 = (archive *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d8b8e,
                          in_stack_ffffffffffffff40);
      paVar5 = archive_read_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       paVar8);
      archive_read_support_format_all(paVar8);
      paVar8 = paVar5;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                          (char *)0x1d8c03,in_stack_ffffffffffffff40);
      iVar2 = archive_read_support_filter_gzip
                        ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if ((iVar2 == 0) || (bVar1)) {
        archive_read_support_filter_all(paVar8);
        paVar8 = paVar5;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d8c8e,in_stack_ffffffffffffff40);
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar8,0x1d8cab);
        paVar8 = paVar5;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d8cdd,in_stack_ffffffffffffff40);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_read_next_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(archive_entry **)paVar8)
          ;
          paVar4 = (archive_entry *)0x0;
          wVar3 = assertion_equal_int((char *)in_stack_ffffffffffffff28,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                      (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,
                                      (char *)0x1d8d56,in_stack_ffffffffffffff40);
          if (wVar3 == L'\0') break;
          archive_entry_pathname(paVar4);
          uVar10 = 0;
          assertion_equal_string
                    (in_stack_ffffffffffffff38,(wchar_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (char *)((ulong)in_stack_ffffffffffffff14 << 0x20),in_stack_ffffffffffffff50,
                     (wchar_t)in_stack_ffffffffffffff58);
          archive_entry_size(local_8);
          paVar8 = (archive *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff28,
                              (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d8e02,
                              in_stack_ffffffffffffff40);
        }
        archive_read_close((archive *)0x1d8e25);
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d8e57,in_stack_ffffffffffffff40);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'¥');
        test_skipping("gzip reading not fully supported on this platform");
      }
      archive_read_free((archive *)0x1d8e64);
      pvVar9 = (void *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d8e92,
                          in_stack_ffffffffffffff40);
      paVar4 = (archive_entry *)archive_write_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       pvVar9);
      archive_write_set_format_ustar
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d8f07,in_stack_ffffffffffffff40);
      archive_write_set_bytes_per_block
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d8f4b,in_stack_ffffffffffffff40);
      iVar2 = 0;
      if (bVar1) {
        iVar2 = -0x14;
      }
      lVar7 = (long)iVar2;
      archive_write_add_filter_gzip(in_stack_ffffffffffffff28);
      paVar6 = paVar4;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d8fa6,in_stack_ffffffffffffff40);
      archive_write_set_filter_option
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar6);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d8ff7,in_stack_ffffffffffffff40);
      archive_write_open_memory
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (size_t *)CONCAT44(in_stack_ffffffffffffff14,uVar10));
      paVar6 = paVar4;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d904e,in_stack_ffffffffffffff40);
      for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
        sprintf(local_48,"file%03d",(ulong)local_5c);
        local_8 = archive_entry_new();
        assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                         in_stack_ffffffffffffff18,
                         (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar6);
        archive_entry_copy_pathname
                  ((archive_entry *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(char *)paVar6);
        archive_entry_set_size(local_8,(int64_t)pvVar11);
        archive_entry_set_filetype(local_8,0x8000);
        archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar6);
        paVar6 = paVar4;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                            (char *)0x1d913d,in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff50 = pvVar11;
        failure("Writing file %s",local_48);
        pvVar11 = in_stack_ffffffffffffff50;
        archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar6,0x1d917d);
        paVar6 = paVar4;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                            (char *)0x1d91b0,in_stack_ffffffffffffff40);
        archive_entry_free((archive_entry *)0x1d91bd);
      }
      archive_write_close((archive *)0x1d91e0);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar4,
                          (char *)0x1d9212,in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d921f);
      paVar8 = (archive *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d924d,
                          in_stack_ffffffffffffff40);
      failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",local_58 & 0xffffffff,
              local_50 & 0xffffffff);
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       paVar8);
      paVar5 = archive_read_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       paVar8);
      archive_read_support_format_all(paVar8);
      paVar8 = paVar5;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                          (char *)0x1d9319,in_stack_ffffffffffffff40);
      archive_read_support_filter_all(paVar8);
      paVar8 = paVar5;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                          (char *)0x1d9358,in_stack_ffffffffffffff40);
      iVar2 = archive_read_support_filter_gzip
                        ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (iVar2 == -0x14) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ý');
        test_skipping("gzip reading not fully supported on this platform");
      }
      else {
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),paVar8,0x1d93b7);
        paVar8 = paVar5;
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d93e9,in_stack_ffffffffffffff40);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_read_next_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(archive_entry **)paVar8)
          ;
          paVar4 = (archive_entry *)0x0;
          wVar3 = assertion_equal_int((char *)in_stack_ffffffffffffff28,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                      (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,
                                      (char *)0x1d9462,in_stack_ffffffffffffff40);
          if (wVar3 == L'\0') break;
          in_stack_ffffffffffffff40 = local_48;
          archive_entry_pathname(paVar4);
          uVar10 = 0;
          assertion_equal_string
                    (in_stack_ffffffffffffff38,(wchar_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (char *)((ulong)in_stack_ffffffffffffff14 << 0x20),in_stack_ffffffffffffff50,
                     (wchar_t)lVar7);
          archive_entry_size(local_8);
          paVar8 = (archive *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff28,
                              (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d950e,
                              in_stack_ffffffffffffff40);
        }
        archive_read_close((archive *)0x1d9531);
        assertion_equal_int((char *)in_stack_ffffffffffffff28,
                            (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar5,
                            (char *)0x1d9563,in_stack_ffffffffffffff40);
      }
      archive_read_free((archive *)0x1d9570);
      pvVar11 = (void *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,
                          (wchar_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d959e,
                          in_stack_ffffffffffffff40);
      paVar8 = archive_write_new();
      assertion_assert((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),
                       pvVar11);
      iVar2 = 0;
      if (bVar1) {
        iVar2 = -0x14;
      }
      file = (char *)(long)iVar2;
      archive_write_add_filter_gzip(in_stack_ffffffffffffff28);
      assertion_equal_int((char *)in_stack_ffffffffffffff28,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d962f,in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d963c);
      pvVar11 = (void *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff28,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d966a,
                          in_stack_ffffffffffffff40);
      paVar8 = archive_write_new();
      assertion_assert(file,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),pvVar11);
      iVar2 = 0;
      if (bVar1) {
        iVar2 = -0x14;
      }
      paVar5 = (archive *)(long)iVar2;
      archive_write_add_filter_gzip(paVar5);
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d96fb,in_stack_ffffffffffffff40);
      archive_write_close((archive *)0x1d9708);
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d9736,
                          in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d9743);
      pvVar11 = (void *)0x0;
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d9771,
                          in_stack_ffffffffffffff40);
      paVar8 = archive_write_new();
      assertion_assert(file,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),pvVar11);
      archive_write_set_format_ustar
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d97e6,in_stack_ffffffffffffff40);
      archive_write_add_filter_gzip(paVar5);
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d9841,in_stack_ffffffffffffff40);
      archive_write_close((archive *)0x1d984e);
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d987c,
                          in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d9889);
      pvVar11 = (void *)0x0;
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d98b7,
                          in_stack_ffffffffffffff40);
      paVar8 = archive_write_new();
      assertion_assert(file,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),pvVar11);
      archive_write_set_format_ustar
                ((archive *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d992c,in_stack_ffffffffffffff40);
      archive_write_add_filter_gzip(paVar5);
      assertion_equal_int((char *)paVar5,(wchar_t)((ulong)file >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d9987,in_stack_ffffffffffffff40);
      archive_write_open_memory
                (paVar5,file,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (size_t *)CONCAT44(in_stack_ffffffffffffff14,uVar10));
      wVar3 = (wchar_t)((ulong)file >> 0x20);
      assertion_equal_int((char *)paVar5,wVar3,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),(longlong)paVar8,
                          (char *)0x1d99de,in_stack_ffffffffffffff40);
      archive_write_close((archive *)0x1d99eb);
      assertion_equal_int((char *)paVar5,wVar3,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d9a19,
                          in_stack_ffffffffffffff40);
      archive_write_free((archive *)0x1d9a26);
      assertion_equal_int((char *)paVar5,wVar3,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)CONCAT44(in_stack_ffffffffffffff14,uVar10),0,(char *)0x1d9a54,
                          in_stack_ffffffffffffff40);
      free(__s);
      free(__ptr);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_gzip)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog = 0;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_gzip(a);
	if (r != ARCHIVE_OK) {
		if (canGzip() && r == ARCHIVE_WARN)
			use_prog = 1;
		else {
			skipping("gzip writing not supported on this platform");
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			free(data);
			return;
		}
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_GZIP, archive_filter_code(a, 0));
	assertEqualString("gzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify gzip writing by reading back;"
		    " gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_options(a, "gzip:nonexistent-option=0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "gzip:compression-level=1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "gzip:compression-level=9"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Curiously, this test fails; the test data above compresses
	 * better at default compression than at level 9. */
	/*
	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Level 1 really does result in larger data. */
	failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}